

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O1

void __thiscall BatchResultValues::add(BatchResultValues *this,CaseValues *result)

{
  pointer *pppCVar1;
  pointer pcVar2;
  iterator __position;
  TestStatusCode TVar3;
  CaseValues *pCVar4;
  CaseValues *copy;
  CaseValues *local_38;
  
  pCVar4 = (CaseValues *)operator_new(0x60);
  (pCVar4->casePath)._M_dataplus._M_p = (pointer)&(pCVar4->casePath).field_2;
  pcVar2 = (result->casePath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pCVar4,pcVar2,pcVar2 + (result->casePath)._M_string_length);
  TVar3 = result->statusCode;
  pCVar4->caseType = result->caseType;
  pCVar4->statusCode = TVar3;
  (pCVar4->statusDetails)._M_dataplus._M_p = (pointer)&(pCVar4->statusDetails).field_2;
  pcVar2 = (result->statusDetails)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->statusDetails,pcVar2,
             pcVar2 + (result->statusDetails)._M_string_length);
  std::vector<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>::vector
            (&pCVar4->values,&result->values);
  __position._M_current =
       (this->m_caseValues).super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_caseValues).super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_38 = pCVar4;
    std::vector<CaseValues*,std::allocator<CaseValues*>>::_M_realloc_insert<CaseValues*const&>
              ((vector<CaseValues*,std::allocator<CaseValues*>> *)&this->m_caseValues,__position,
               &local_38);
  }
  else {
    *__position._M_current = pCVar4;
    pppCVar1 = &(this->m_caseValues).super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return;
}

Assistant:

void add (const CaseValues& result)
	{
		CaseValues* copy = new CaseValues(result);
		try
		{
			m_caseValues.push_back(copy);
		}
		catch (...)
		{
			delete copy;
			throw;
		}
	}